

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

int megumax::eval(Position *pos)

{
  PieceType pt;
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  Square sq;
  ulong uVar11;
  int iVar12;
  
  iVar12 = 0;
  iVar10 = 0;
  iVar5 = 0;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 4) {
    iVar6 = *(int *)((long)&libchess::constants::COLORS + lVar7);
    for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
      pt.super_MetaValueType<int>.value_ =
           (MetaValueType<int>)
           ((MetaValueType<int> *)((long)&libchess::constants::PIECE_TYPES + lVar9))->value_;
      uVar11 = pos->piece_type_bb_[(int)pt.super_MetaValueType<int>.value_].value_ &
               pos->color_bb_[iVar6].value_;
      uVar8 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      iVar1 = *(int *)(piece_values + (long)(int)pt.super_MetaValueType<int>.value_ * 4);
      while (uVar11 != 0) {
        lVar2 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar11 = uVar11 & uVar11 - 1;
        sq.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)(MetaValueType<int>)((value_type)lVar2 ^ 0x38);
        if (iVar6 == 0) {
          sq.super_MetaValueType<int>.value_ =
               (MetaValueType<int>)(MetaValueType<int>)(value_type)lVar2;
        }
        iVar3 = pst_mg(pt,sq);
        iVar4 = pst_eg(pt,sq);
        iVar10 = iVar10 + iVar3;
        iVar12 = iVar12 + iVar4;
      }
      iVar5 = (uint)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) *
              iVar1 + iVar5;
    }
    iVar5 = -iVar5;
    iVar10 = -iVar10;
    iVar12 = -iVar12;
  }
  iVar6 = phase(pos);
  iVar5 = (iVar6 * iVar12 + (0x100 - iVar6) * iVar10) / 0x100 + iVar5;
  if ((pos->side_to_move_).super_MetaValueType<int>.value_ != 0) {
    iVar5 = -iVar5;
  }
  return iVar5;
}

Assistant:

int eval(const Position& pos) {
    int score = 0;
    int mg_score = 0;
    int eg_score = 0;

    for (Color color : constants::COLORS) {
        for (PieceType piece_type : constants::PIECE_TYPES) {
            Bitboard piece_bb = pos.piece_type_bb(piece_type, color);

            // Material
            score += piece_values[piece_type.value()] * piece_bb.popcount();

            while (piece_bb) {
                Square piece_sq = piece_bb.forward_bitscan();
                piece_bb.forward_popbit();

                // PST
                if (color == constants::WHITE) {
                    mg_score += pst_mg(piece_type, piece_sq);
                    eg_score += pst_eg(piece_type, piece_sq);
                } else {
                    mg_score += pst_mg(piece_type, piece_sq.flipped());
                    eg_score += pst_eg(piece_type, piece_sq.flipped());
                }
            }
        }

        score = -score;
        mg_score = -mg_score;
        eg_score = -eg_score;
    }

    // Phase
    const int p = phase(pos);
    score += ((mg_score * (256 - p)) + (eg_score * p)) / 256;

    // Return from side to move's pov
    if (pos.side_to_move() != constants::WHITE) {
        score = -score;
    }

    return score;
}